

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O0

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,ReturnStatement *ret_stmt,void *data)

{
  bool bVar1;
  Instruction IVar2;
  pointer pSVar3;
  Function *pFVar4;
  CodeGenerateVisitor *in_RSI;
  CodeGenerateVisitor *in_RDI;
  Instruction instruction;
  Function *function;
  ExpListData_conflict exp_list_data;
  int register_id;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  ExpListData local_24 [2];
  int local_1c;
  Instruction i;
  
  local_1c = GetNextRegisterId(in_RDI);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                     0x19e134);
  if (bVar1) {
    local_1c = GenerateRegisterId(in_RSI);
    ExpListData::ExpListData(local_24,local_1c,-1);
    pSVar3 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                       ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                        0x19e169);
    (*pSVar3->_vptr_SyntaxTree[2])(pSVar3,in_RDI,local_24);
  }
  pFVar4 = GetCurrentFunction(in_RDI);
  i.opcode_ = (uint)((ulong)pFVar4 >> 0x20);
  IVar2 = Instruction::AsBxCode((OpType)in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  Function::AddInstruction
            ((Function *)CONCAT44(IVar2.opcode_,IVar2.opcode_),i,(int)((ulong)in_RDI >> 0x20));
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(ReturnStatement *ret_stmt, void *data)
    {
        int register_id = GetNextRegisterId();
        if (ret_stmt->exp_list_)
        {
            register_id = GenerateRegisterId();
            ExpListData exp_list_data{ register_id, EXP_VALUE_COUNT_ANY };
            ret_stmt->exp_list_->Accept(this, &exp_list_data);
        }

        auto function = GetCurrentFunction();
        auto instruction = Instruction::AsBxCode(OpType_Ret, register_id,
                                                 ret_stmt->exp_value_count_);
        function->AddInstruction(instruction, ret_stmt->line_);
    }